

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

string * basisu::string_format_abi_cxx11_(char *pFmt,...)

{
  allocator<char> *in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  string *in_RDI;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  va_list args;
  char buf [2048];
  undefined1 local_908 [16];
  undefined8 local_8f8;
  allocator<char> local_839;
  undefined4 local_838;
  undefined4 local_834;
  undefined1 *local_830;
  undefined1 *local_828;
  char local_818 [2056];
  char *local_10;
  string *local_8;
  
  local_828 = local_908;
  local_830 = &stack0x00000008;
  local_834 = 0x30;
  local_838 = 0x10;
  local_8f8 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  vsnprintf(local_818,0x800,in_RSI,&local_838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_R9,in_R8,in_RCX);
  std::allocator<char>::~allocator(&local_839);
  return in_RDI;
}

Assistant:

inline std::string string_format(const char* pFmt, ...)
	{
		char buf[2048];

		va_list args;
		va_start(args, pFmt);
#ifdef _WIN32		
		vsprintf_s(buf, sizeof(buf), pFmt, args);
#else
		vsnprintf(buf, sizeof(buf), pFmt, args);
#endif		
		va_end(args);

		return std::string(buf);
	}